

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_object.cpp
# Opt level: O1

string * booster::shared_object::name
                   (string *__return_storage_ptr__,string *module,string *soversion)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,"lib",module);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
    local_80 = (long *)*plVar2;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
    local_60 = (long *)*plVar2;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_60,(ulong)(soversion->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string shared_object::name(std::string const &module,std::string const &soversion)
	{

		#if defined __APPLE__
		return BOOSTER_LIBRARY_PREFIX + module + "." + soversion + BOOSTER_LIBRARY_SUFFIX;
		#elif defined BOOSTER_WIN32
		return BOOSTER_LIBRARY_PREFIX + module + "-" + soversion + BOOSTER_LIBRARY_SUFFIX;
		#else
		return BOOSTER_LIBRARY_PREFIX + module + BOOSTER_LIBRARY_SUFFIX + "." + soversion;
		#endif
	}